

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O1

void __thiscall JUnitTestOutput::writeTestCases(JUnitTestOutput *this)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  JUnitTestCaseResultNode *this_00;
  SimpleString local_50;
  SimpleString buf;
  
  this_00 = (this->impl_->results_).head_;
  if (this_00 != (JUnitTestCaseResultNode *)0x0) {
    do {
      pcVar5 = SimpleString::asCharString(&this->impl_->package_);
      bVar4 = SimpleString::isEmpty(&this->impl_->package_);
      pcVar9 = ".";
      if (bVar4) {
        pcVar9 = "";
      }
      pcVar6 = SimpleString::asCharString(&(this->impl_->results_).group_);
      pcVar7 = SimpleString::asCharString(&this_00->name_);
      sVar2 = this_00->checkCount_;
      sVar3 = (this->impl_->results_).totalCheckCount_;
      uVar1 = this_00->execTime_;
      uVar10 = uVar1 / 1000;
      pcVar8 = SimpleString::asCharString(&this_00->file_);
      StringFromFormat((char *)&buf,
                       "<testcase classname=\"%s%s%s\" name=\"%s\" assertions=\"%d\" time=\"%d.%03d\" file=\"%s\" line=\"%d\">\n"
                       ,pcVar5,pcVar9,pcVar6,pcVar7,(ulong)(uint)((int)sVar2 - (int)sVar3),uVar10,
                       (ulong)(uint)((int)uVar1 + (int)uVar10 * -1000),pcVar8,
                       (ulong)(uint)this_00->lineNumber_);
      pcVar5 = SimpleString::asCharString(&buf);
      SimpleString::SimpleString(&local_50,pcVar5);
      (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_50);
      SimpleString::~SimpleString(&local_50);
      (this->impl_->results_).totalCheckCount_ = this_00->checkCount_;
      if (this_00->failure_ == (TestFailure *)0x0) {
        if (this_00->ignored_ == true) {
          SimpleString::SimpleString(&local_50,"<skipped />\n");
          (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_50);
          SimpleString::~SimpleString(&local_50);
        }
      }
      else {
        (*(this->super_TestOutput)._vptr_TestOutput[0x22])(this,this_00);
      }
      SimpleString::SimpleString(&local_50,"</testcase>\n");
      (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_50);
      SimpleString::~SimpleString(&local_50);
      this_00 = this_00->next_;
      SimpleString::~SimpleString(&buf);
    } while (this_00 != (JUnitTestCaseResultNode *)0x0);
  }
  return;
}

Assistant:

void JUnitTestOutput::writeTestCases()
{
    JUnitTestCaseResultNode* cur = impl_->results_.head_;

    while (cur) {
        SimpleString buf = StringFromFormat(
                "<testcase classname=\"%s%s%s\" name=\"%s\" assertions=\"%d\" time=\"%d.%03d\" file=\"%s\" line=\"%d\">\n",
                impl_->package_.asCharString(),
                impl_->package_.isEmpty() ? "" : ".",
                impl_->results_.group_.asCharString(),
                cur->name_.asCharString(),
                (int) (cur->checkCount_ - impl_->results_.totalCheckCount_),
                (int) (cur->execTime_ / 1000), (int)(cur->execTime_ % 1000),
                cur->file_.asCharString(),
                (int) cur->lineNumber_);
        writeToFile(buf.asCharString());

        impl_->results_.totalCheckCount_ = cur->checkCount_;

        if (cur->failure_) {
            writeFailure(cur);
        }
        else if (cur->ignored_) {
            writeToFile("<skipped />\n");
        }
        writeToFile("</testcase>\n");
        cur = cur->next_;
    }
}